

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O2

void __thiscall webrtc::AudioBuffer::~AudioBuffer(AudioBuffer *this)

{
  this->_vptr_AudioBuffer = (_func_int **)&PTR__AudioBuffer_001d42a0;
  std::
  vector<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>,_std::allocator<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>_>_>
  ::~vector(&this->output_resamplers_);
  std::
  vector<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>,_std::allocator<std::unique_ptr<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>_>_>
  ::~vector(&this->input_resamplers_);
  std::unique_ptr<webrtc::ChannelBuffer<float>,_std::default_delete<webrtc::ChannelBuffer<float>_>_>
  ::~unique_ptr(&this->process_buffer_);
  std::unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>::
  ~unique_ptr(&this->output_buffer_);
  std::unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>::
  ~unique_ptr(&this->input_buffer_);
  std::unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  ::~unique_ptr(&this->low_pass_reference_channels_);
  std::unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  ::~unique_ptr(&this->mixed_low_pass_channels_);
  std::unique_ptr<webrtc::SplittingFilter,_std::default_delete<webrtc::SplittingFilter>_>::
  ~unique_ptr(&this->splitting_filter_);
  std::unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>::
  ~unique_ptr(&this->split_data_);
  std::unique_ptr<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>::
  ~unique_ptr(&this->data_);
  return;
}

Assistant:

AudioBuffer::~AudioBuffer() {}